

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

Edge * __thiscall Graph::getEdge(Graph *this,int from,int to)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference ppEVar4;
  undefined8 *puVar5;
  int in_EDX;
  int in_ESI;
  vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
  *in_RDI;
  size_t i;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
            ::size(in_RDI);
    if (sVar2 <= local_18) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "Edge not found!";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    pvVar3 = std::
             vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ::operator[](in_RDI,(long)in_ESI);
    ppEVar4 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[](pvVar3,local_18);
    bVar1 = Edge::connectsTo(*ppEVar4,in_EDX);
    if (bVar1) break;
    local_18 = local_18 + 1;
  }
  pvVar3 = std::
           vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
           ::operator[](in_RDI,(long)in_ESI);
  ppEVar4 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[](pvVar3,local_18);
  return *ppEVar4;
}

Assistant:

const Edge* Graph::getEdge(int from, int to) {
  for(size_t i = 0; i < adjList.size(); i++) {
    if(adjList[from][i]->connectsTo(to)) {
      return (adjList[from][i]);
    }
  }
  throw "Edge not found!";
}